

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O0

int __thiscall
CTcLibParserCmdline::get_pp_symbol
          (CTcLibParserCmdline *this,char *dst,size_t dst_len,char *sym_name,size_t sym_len)

{
  char *__s;
  CTcMake *__n;
  char *in_RCX;
  CTcMake *in_RDX;
  void *in_RSI;
  size_t in_R8;
  size_t val_len;
  char *val;
  undefined4 local_4;
  
  __s = CTcMake::look_up_pp_sym(in_RDX,in_RCX,in_R8);
  if (__s == (char *)0x0) {
    local_4 = -1;
  }
  else {
    __n = (CTcMake *)strlen(__s);
    if (__n <= in_RDX) {
      memcpy(in_RSI,__s,(size_t)__n);
    }
    local_4 = (int)__n;
  }
  return local_4;
}

Assistant:

int get_pp_symbol(char *dst, size_t dst_len,
                      const char *sym_name, size_t sym_len)
    {
        const char *val;
        size_t val_len;

        /* ask the 'make' control object for the expansion */
        val = mk_->look_up_pp_sym(sym_name, sym_len);

        /* if we didn't find a value, return undefined */
        if (val == 0)
            return -1;

        /* if it fits in the caller's result buffer, copy it */
        val_len = strlen(val);
        if (val_len <= dst_len)
            memcpy(dst, val, val_len);

        /* return the value length */
        return val_len;
    }